

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileContext.cpp
# Opt level: O0

ssize_t __thiscall higan::FileContext::ReadFileToBuffer(FileContext *this,Buffer *buffer)

{
  size_t sVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  ssize_t read_size;
  Buffer *buffer_local;
  FileContext *this_local;
  
  if ((buffer == (Buffer *)0x0) ||
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->file_ptr_), !bVar2)) {
    this_local = (FileContext *)0xffffffffffffffff;
  }
  else if ((this->read_over_ & 1U) == 0) {
    peVar3 = std::__shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file_ptr_);
    this_local = (FileContext *)FileForRead::ReadFileToBuffer(peVar3,buffer);
    if (0 < (long)this_local) {
      this->sum_read_from_cache_ =
           (size_t)(&this_local->close_connection_ + this->sum_read_from_cache_);
      sVar1 = this->sum_read_from_cache_;
      peVar3 = std::
               __shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->file_ptr_);
      sVar4 = FileForRead::GetFileSize(peVar3);
      if (sVar1 == sVar4) {
        this->read_over_ = true;
      }
    }
  }
  else {
    this_local = (FileContext *)0x0;
  }
  return (ssize_t)this_local;
}

Assistant:

ssize_t FileContext::ReadFileToBuffer(Buffer* buffer)
{
	if (!buffer || !file_ptr_)
	{
		return -1;
	}

	if (read_over_)
	{
		return 0;
	}

	ssize_t read_size = file_ptr_->ReadFileToBuffer(buffer);
	if (read_size > 0)
	{
		sum_read_from_cache_ += read_size;
		if (sum_read_from_cache_ == file_ptr_->GetFileSize())
		{
			read_over_ = true;
		}
	}

	return read_size;
}